

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_parser_parsePrimaryTerm(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  int iVar1;
  sysbvm_parser_state_t *state_local;
  sysbvm_context_t *context_local;
  
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  switch(iVar1) {
  case 0:
  case 1:
  case 3:
  case 7:
  case 8:
    context_local = (sysbvm_context_t *)sysbvm_parser_parseLiteralTokenValue(context,state);
    break;
  case 2:
  case 5:
  case 6:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x14:
  case 0x19:
    context_local =
         (sysbvm_context_t *)sysbvm_parser_parseIdentifierReferenceReference(context,state);
    break;
  default:
    context_local = (sysbvm_context_t *)sysbvm_parser_unexpectedTokenAt(context,state);
    break;
  case 9:
    context_local = (sysbvm_context_t *)sysbvm_parser_parseParenthesesExpression(context,state);
    break;
  case 0xd:
    context_local = (sysbvm_context_t *)sysbvm_parser_parseBlockExpression(context,state);
    break;
  case 0x1e:
    context_local = (sysbvm_context_t *)sysbvm_parser_parseByteArrayExpression(context,state);
    break;
  case 0x1f:
    context_local = (sysbvm_context_t *)sysbvm_parser_parseDictionaryExpression(context,state);
    break;
  case 0x20:
    context_local = (sysbvm_context_t *)sysbvm_parser_parseLiteralArrayExpression(context,state);
    break;
  case -1:
    context_local = (sysbvm_context_t *)0x0;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parsePrimaryTerm(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    switch(sysbvm_parser_lookKindAt(state, 0))
    {
    case -1: return SYSBVM_NULL_TUPLE;
    case SYSBVM_TOKEN_KIND_IDENTIFIER:
    case SYSBVM_TOKEN_KIND_ELLIPSIS:
    case SYSBVM_TOKEN_KIND_OPERATOR:
    case SYSBVM_TOKEN_KIND_BAR:
    case SYSBVM_TOKEN_KIND_STAR:
    case SYSBVM_TOKEN_KIND_LESS_THAN:
    case SYSBVM_TOKEN_KIND_GREATER_THAN:
    case SYSBVM_TOKEN_KIND_MULTI_KEYWORD:
        return sysbvm_parser_parseIdentifierReferenceReference(context, state);

    case SYSBVM_TOKEN_KIND_CHARACTER:
    case SYSBVM_TOKEN_KIND_INTEGER:
    case SYSBVM_TOKEN_KIND_FLOAT:
    case SYSBVM_TOKEN_KIND_STRING:
    case SYSBVM_TOKEN_KIND_SYMBOL:
        return sysbvm_parser_parseLiteralTokenValue(context, state);

    case SYSBVM_TOKEN_KIND_LPARENT:
        return sysbvm_parser_parseParenthesesExpression(context, state);
    case SYSBVM_TOKEN_KIND_LCBRACKET:
        return sysbvm_parser_parseBlockExpression(context, state);
    case SYSBVM_TOKEN_KIND_LITERAL_ARRAY_START:
        return sysbvm_parser_parseLiteralArrayExpression(context, state);
    case SYSBVM_TOKEN_KIND_BYTE_ARRAY_START:
        return sysbvm_parser_parseByteArrayExpression(context, state);
    case SYSBVM_TOKEN_KIND_DICTIONARY_START:
        return sysbvm_parser_parseDictionaryExpression(context, state);

    default:
        return sysbvm_parser_unexpectedTokenAt(context, state);
    }
}